

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O0

void t11(void)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  void *__s1;
  _Bool ok_4;
  _Bool ok_3;
  _Bool ok_2;
  _Bool ok_1;
  _Bool ok;
  size_t sz;
  ALLEGRO_USTR *us2;
  ALLEGRO_USTR *us1;
  
  uVar3 = al_ustr_new(anon_var_dwarf_3b4);
  uVar4 = al_ustr_new(anon_var_dwarf_3ca);
  al_ustr_insert(uVar3,0x12,uVar4);
  pcVar5 = (char *)al_cstr(uVar3);
  iVar2 = strcmp(pcVar5,anon_var_dwarf_1c8);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_31e);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_31e);
    error = error + 1;
  }
  al_ustr_insert(uVar4,3,uVar4);
  pcVar5 = (char *)al_cstr(uVar4);
  iVar2 = strcmp(pcVar5,anon_var_dwarf_3d4);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_3ea);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_3ea);
    error = error + 1;
  }
  bVar1 = al_ustr_insert(uVar4,0xffffffff,uVar4);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    log_printf("FAIL %s\n","!al_ustr_insert(us2, -1, us2)");
    error = error + 1;
  }
  else {
    log_printf("OK   %s\n","!al_ustr_insert(us2, -1, us2)");
  }
  lVar6 = al_ustr_size(uVar4);
  al_ustr_insert(uVar4,(int)lVar6 + 3,uVar4);
  lVar7 = al_ustr_size(uVar4);
  if (lVar7 == lVar6 * 2 + 3) {
    log_printf("OK   %s\n","al_ustr_size(us2) == sz + sz + 3");
  }
  else {
    log_printf("FAIL %s\n","al_ustr_size(us2) == sz + sz + 3");
    error = error + 1;
  }
  __s1 = (void *)al_cstr(uVar4);
  iVar2 = memcmp(__s1,anon_var_dwarf_414,lVar6 * 2 + 3);
  if (iVar2 == 0) {
    log_printf("OK   %s\n",anon_var_dwarf_42a);
  }
  else {
    log_printf("FAIL %s\n",anon_var_dwarf_42a);
    error = error + 1;
  }
  al_ustr_free(uVar3);
  al_ustr_free(uVar4);
  return;
}

Assistant:

static void t11(void)
{
   ALLEGRO_USTR *us1;
   ALLEGRO_USTR *us2;
   size_t sz;

   /* Insert in middle. */
   us1 = al_ustr_new("aábdðeéfghiíjkprstuúvxyýþæö");
   us2 = al_ustr_new("lmnoó");
   al_ustr_insert(us1, 18, us2);
   CHECK(0 == strcmp(al_cstr(us1), "aábdðeéfghiíjklmnoóprstuúvxyýþæö"));

   /* Insert into itself. */
   al_ustr_insert(us2, 3, us2);
   CHECK(0 == strcmp(al_cstr(us2), "lmnlmnoóoó"));

   /* Insert before start (not allowed). */
   CHECK(!al_ustr_insert(us2, -1, us2));

   /* Insert past end (will be padded with NULs). */
   sz = al_ustr_size(us2);
   al_ustr_insert(us2, sz + 3, us2);
   CHECK(al_ustr_size(us2) == sz + sz + 3);
   CHECK(0 == memcmp(al_cstr(us2), "lmnlmnoóoó\0\0\0lmnlmnoóoó", sz + sz + 3));

   al_ustr_free(us1);
   al_ustr_free(us2);
}